

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O1

bool __thiscall MP1Node::joinReqHandler(MP1Node *this,void *env,char *data,int size)

{
  long heartbeat;
  short port;
  int id;
  MP1Node *pMVar1;
  Address requesterAddress;
  string reqAddStr;
  Address local_98;
  undefined1 local_90 [32];
  undefined1 local_70 [40];
  long local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"start joinReqHandler...",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if (size < 0xe) {
    Log::LOG(this->log,&this->memberNode->addr,"Message JOINREQ received with size wrong. Ignored.")
    ;
  }
  else {
    local_98.addr._4_2_ = *(undefined2 *)(data + 4);
    local_98.addr._0_4_ = *(undefined4 *)data;
    heartbeat = *(long *)(data + 6);
    Address::getAddress_abi_cxx11_((string *)(local_70 + 0x20),&local_98);
    pMVar1 = (MP1Node *)local_70;
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pMVar1,local_70._32_8_,
               ((Address *)(local_70._32_8_ + 8))->addr + local_48 + -8);
    id = getIdFromAddress(pMVar1,(string *)local_70);
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_);
    }
    pMVar1 = (MP1Node *)local_90;
    local_90._0_8_ = local_90 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pMVar1,local_70._32_8_,
               ((Address *)(local_70._32_8_ + 8))->addr + local_48 + -8);
    port = getPortFromAddress(pMVar1,(string *)local_90);
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_);
    }
    updateMembershipList(this,id,port,heartbeat);
    sendMembershipList(this,&local_98,JOINREP);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"...end joinReqHandler.",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    if ((Member *)local_70._32_8_ != (Member *)&stack0xffffffffffffffc0) {
      operator_delete((void *)local_70._32_8_);
    }
  }
  return 0xd < size;
}

Assistant:

bool MP1Node::joinReqHandler(void *env, char *data, int size) {
    cout << "start joinReqHandler..." << endl;

    if (size < (int)(sizeof(memberNode->addr.addr) + sizeof(long))) {
#ifdef DEBUGLOG
        log->LOG(&memberNode->addr, "Message JOINREQ received with size wrong. Ignored.");
#endif
        return false;
    }

    //Get requester information
    //message structure ---> MsgType, address, number of members, member data (id, port, heartbeat)
    Address requesterAddress;
    memcpy(requesterAddress.addr, data, sizeof(memberNode->addr.addr));     //extract requester's Address from data
    data += sizeof(memberNode->addr.addr);
    size -= sizeof(memberNode->addr.addr);

    long heartbeat;
    memcpy(&heartbeat, data, sizeof(long));   //extract heartbeat from data
    //data += sizeof(long);
    //size -= sizeof(long);

    //Get id and port
    string reqAddStr = (requesterAddress.getAddress());
    int id = getIdFromAddress(reqAddStr);
    short port = getPortFromAddress(reqAddStr);

    //update the member in the membership list
    updateMembershipList(id, port, heartbeat);

    //send membership list to requester
    sendMembershipList(&requesterAddress, JOINREP);

    cout << "...end joinReqHandler." << endl;
    return true;
}